

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_limit_h_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax,REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  REF_DBL *pRVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  REF_DBL current_complexity;
  REF_GRID local_70;
  REF_DBL local_68;
  REF_DBL local_60;
  double local_58;
  REF_DBL local_48;
  
  pRVar1 = ref_grid->node;
  local_58 = target_complexity;
  if (target_complexity <= -target_complexity) {
    local_58 = -target_complexity;
  }
  iVar4 = 0;
  local_70 = ref_grid;
  local_68 = hmin;
  local_60 = hmax;
  local_48 = target_complexity;
  do {
    if (iVar4 == 10) {
      return 0;
    }
    uVar2 = ref_metric_complexity(metric,ref_grid,&current_complexity);
    if (uVar2 != 0) {
      pcVar6 = "cmp";
      uVar3 = 0x85a;
      goto LAB_001bc30b;
    }
    dVar9 = current_complexity * 1e+20;
    if (dVar9 <= -dVar9) {
      dVar9 = -dVar9;
    }
    if (dVar9 <= local_58) {
      return 4;
    }
    pRVar5 = metric;
    for (lVar7 = 0; ref_grid = local_70, lVar7 < pRVar1->max; lVar7 = lVar7 + 1) {
      if (-1 < pRVar1->global[lVar7]) {
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          dVar9 = pow(local_48 / current_complexity,0.6666666666666666);
          pRVar5[lVar8] = dVar9 * pRVar5[lVar8];
        }
      }
      pRVar5 = pRVar5 + 6;
    }
    uVar2 = ref_metric_limit_h(metric,local_70,local_68,local_60);
    iVar4 = iVar4 + 1;
  } while (uVar2 == 0);
  pcVar6 = "limit h";
  uVar3 = 0x862;
LAB_001bc30b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar3,
         "ref_metric_limit_h_at_complexity",(ulong)uVar2,pcVar6);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h_at_complexity(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL hmin, REF_DBL hmax,
                                                    REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node, relaxations;
  REF_DBL current_complexity;

  /* global scaling and h limits */
  for (relaxations = 0; relaxations < 10; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(target_complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, 2.0 / 3.0);
    }
    RSS(ref_metric_limit_h(metric, ref_grid, hmin, hmax), "limit h");
  }

  return REF_SUCCESS;
}